

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node4FullDeleteEndAndMiddle_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  key_type key;
  key_type k;
  size_t *psVar1;
  initializer_list<int> absent_keys;
  initializer_list<int> absent_keys_00;
  value_view v;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_540;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  k = 1;
  psVar1 = &DAT_002ef170;
  do {
    v._M_extent._M_extent_value = *psVar1;
    v._M_ptr = (pointer)psVar1[-1];
    unodb::test::
    tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
    ::insert_internal(&local_500,k,v,false);
    k = k + 1;
    psVar1 = psVar1 + 2;
  } while (k != 5);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,4,false);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_500);
  local_540._M_elems[0] = 4;
  local_540._M_elems[1] = CONCAT44(local_540._M_elems[1]._4_4_,5);
  absent_keys._M_len = 3;
  absent_keys._M_array = (iterator)&local_540;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>(&local_500,absent_keys);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  remove<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,2,false);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_500);
  local_540._M_elems[0] = 0x400000002;
  local_540._M_elems[1] = 0x500000000;
  absent_keys_00._M_len = 4;
  absent_keys_00._M_array = (iterator)&local_540;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>(&local_500,absent_keys_00);
  local_540._M_elems[0] = 2;
  local_540._M_elems[1] = 1;
  local_540._M_elems[2] = 0;
  local_540._M_elems[3] = 0;
  local_540._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts(&local_500,&local_540);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
            (&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node4FullDeleteEndAndMiddle) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 4);

  // Delete from Node4 end
  unodb::test::must_not_allocate([&verifier] { verifier.remove(4); });

  verifier.check_present_values();
  verifier.check_absent_keys({4, 0, 5});

  // Delete from Node4 middle
  unodb::test::must_not_allocate([&verifier] { verifier.remove(2); });

  verifier.check_present_values();
  verifier.check_absent_keys({2, 4, 0, 5});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({2, 1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}